

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugins_types.c
# Opt level: O0

LY_ERR lyplg_type_identity_isderived(lysc_ident *base,lysc_ident *der)

{
  LY_ERR LVar1;
  lysc_ident *local_38;
  lysc_ident *local_28;
  uint64_t u;
  lysc_ident *der_local;
  lysc_ident *base_local;
  
  if (base->module->ctx != der->module->ctx) {
    __assert_fail("base->module->ctx == der->module->ctx",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/plugins_types.c"
                  ,0x38f,
                  "LY_ERR lyplg_type_identity_isderived(const struct lysc_ident *, const struct lysc_ident *)"
                 );
  }
  local_28 = (lysc_ident *)0x0;
  while( true ) {
    if (base->derived == (lysc_ident **)0x0) {
      local_38 = (lysc_ident *)0x0;
    }
    else {
      local_38 = base->derived[-1];
    }
    if (local_38 <= local_28) {
      return LY_ENOTFOUND;
    }
    if (der == base->derived[(long)local_28]) {
      return LY_SUCCESS;
    }
    LVar1 = lyplg_type_identity_isderived(base->derived[(long)local_28],der);
    if (LVar1 == LY_SUCCESS) break;
    local_28 = (lysc_ident *)((long)&local_28->name + 1);
  }
  return LY_SUCCESS;
}

Assistant:

LIBYANG_API_DEF LY_ERR
lyplg_type_identity_isderived(const struct lysc_ident *base, const struct lysc_ident *der)
{
    LY_ARRAY_COUNT_TYPE u;

    assert(base->module->ctx == der->module->ctx);

    LY_ARRAY_FOR(base->derived, u) {
        if (der == base->derived[u]) {
            return LY_SUCCESS;
        }
        if (!lyplg_type_identity_isderived(base->derived[u], der)) {
            return LY_SUCCESS;
        }
    }
    return LY_ENOTFOUND;
}